

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

unsigned_short * __thiscall
r_code::vector<unsigned_short>::operator[](vector<unsigned_short> *this,size_t i)

{
  reference pvVar1;
  
  if ((ulong)((long)(this->m_vector).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_vector).
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start >> 1) <= i) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize(&this->m_vector,i + 1);
  }
  pvVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::at(&this->m_vector,i);
  return pvVar1;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }